

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

bool __thiscall StatisticsApp::display(StatisticsApp *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  StatisticsWriter writer;
  string local_80;
  StatisticsWriter local_60;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"#","");
  paVar1 = &local_60._comment.field_2;
  local_60._comment._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,local_38 + (long)local_40);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if ((this->_options).showStatistics == true) {
    StatisticsWriter::writeStatistics(&local_60,this->_outputStream,&this->_tracker);
  }
  if ((this->_options).showCovariance == true) {
    poVar2 = this->_outputStream;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Covariance","");
    StatisticsWriter::writeMatrix<double>(&local_60,poVar2,&this->_tracker,&local_80,0x18da68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->_options).showCorrelation == true) {
    poVar2 = this->_outputStream;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Correlation","");
    StatisticsWriter::writeMatrix<double>(&local_60,poVar2,&this->_tracker,&local_80,0x195ca6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->_options).showLeastSquaresOffset == true) {
    poVar2 = this->_outputStream;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Offset","");
    StatisticsWriter::writeMatrix<double>(&local_60,poVar2,&this->_tracker,&local_80,0x195d4c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->_options).showLeastSquaresSlope == true) {
    poVar2 = this->_outputStream;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Slope","");
    StatisticsWriter::writeMatrix<double>(&local_60,poVar2,&this->_tracker,&local_80,0x195dbc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->_options).showHistogram == true) {
    StatisticsWriter::writeHistograms(&local_60,this->_outputStream,&this->_tracker);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._comment._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._comment._M_dataplus._M_p,
                    local_60._comment.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool
    display()
    {

        // ==================================================
        // Write output to stream
        // --------------------------------------------------
        StatisticsWriter writer;
        
        // Show statistics
        if (this->_options.showStatistics)
        {
            writer.writeStatistics(*this->_outputStream, this->_tracker);
        }
        
        // Show covariance
        if (this->_options.showCovariance)
        {
            writer.writeMatrix<double>(*this->_outputStream, this->_tracker, "Covariance", &MultivariateTracker::getCovariance);
        }

        // Show correlation
        if (this->_options.showCorrelation)
        {
            writer.writeMatrix<double>(*this->_outputStream, this->_tracker, "Correlation", &MultivariateTracker::getCorrelation);
        }

        // Show least squares fit offset
        if (this->_options.showLeastSquaresOffset)
        {
            writer.writeMatrix<double>(*this->_outputStream, this->_tracker, "Offset", &MultivariateTracker::getLeastSquaresOffset);
        }

        // Show least squares fit slope
        if (this->_options.showLeastSquaresSlope)
        {
            writer.writeMatrix<double>(*this->_outputStream, this->_tracker, "Slope", &MultivariateTracker::getLeastSquaresSlope);
        }
        
        // Show histogram
        if (this->_options.showHistogram)
        {
            writer.writeHistograms(*this->_outputStream, this->_tracker);
        }

        return true;

    }